

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_clock.cpp
# Opt level: O0

FString __thiscall Stat_rendertimes::GetStats(Stat_rendertimes *this)

{
  int iVar1;
  uint uVar2;
  int t;
  Stat_rendertimes *this_local;
  
  if (GetStats()::buff == '\0') {
    iVar1 = __cxa_guard_acquire(&GetStats()::buff);
    if (iVar1 != 0) {
      FString::FString(&GetStats::buff);
      __cxa_atexit(FString::~FString,&GetStats::buff,&__dso_handle);
      __cxa_guard_release(&GetStats()::buff);
    }
  }
  uVar2 = I_FPSTime();
  if (1000 < (int)(uVar2 - GetStats::lasttime)) {
    FString::Truncate(&GetStats::buff,0);
    AppendRenderTimes(&GetStats::buff);
    GetStats::lasttime = uVar2;
  }
  FString::FString((FString *)this,&GetStats::buff);
  return (FString)(char *)this;
}

Assistant:

ADD_STAT(rendertimes)
{
	static FString buff;
	static int lasttime=0;
	int t=I_FPSTime();
	if (t-lasttime>1000) 
	{
		buff.Truncate(0);
		AppendRenderTimes(buff);
		lasttime=t;
	}
	return buff;
}